

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapNodeDelay(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  Ivy_Supp_t *pIVar1;
  Ivy_Obj_t *pObj_00;
  Ivy_Supp_t *pIVar2;
  int local_3c;
  int local_30;
  int local_2c;
  int Delay;
  int c;
  Ivy_Supp_t *pSuppF;
  Ivy_Supp_t *pSupp;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  local_30 = 0;
  pIVar1 = Ivy_ObjSupp(pAig,pObj);
  for (local_2c = 0; local_2c < pIVar1->nSize; local_2c = local_2c + 1) {
    pObj_00 = Ivy_ManObj(pAig,*(int *)(&pIVar1[1].nSize + (long)local_2c * 4));
    pIVar2 = Ivy_ObjSupp(pAig,pObj_00);
    if (pIVar2->Delay < local_30) {
      local_3c = local_30;
    }
    else {
      local_3c = (int)pIVar2->Delay;
    }
    local_30 = local_3c;
  }
  return local_30 + 1;
}

Assistant:

int Ivy_FastMapNodeDelay( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSupp, * pSuppF;
    int c, Delay = 0;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    for ( c = 0; c < pSupp->nSize; c++ )
    {
        pSuppF = Ivy_ObjSupp( pAig, Ivy_ManObj(pAig, pSupp->pArray[c]) );
        Delay = IVY_MAX( Delay, pSuppF->Delay );
    }
    return 1 + Delay;
}